

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles2::Functional::calculateLodDerivateParts(Functional *this,Mat3 *transformation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vec2 VVar8;
  float *pfVar9;
  undefined8 extraout_XMM0_Qa;
  ulong uVar10;
  Vec4 VVar11;
  Vector<float,_3> local_a8;
  Vector<float,_3> local_9c;
  VecAccess<float,_3,_2> local_90;
  Vector<float,_2> local_80;
  Vec2 trans10;
  Vector<float,_3> local_6c;
  VecAccess<float,_3,_2> local_60;
  Vector<float,_2> local_50;
  Vec2 trans01;
  Vector<float,_3> local_3c;
  VecAccess<float,_3,_2> local_30;
  Vector<float,_2> local_20;
  Vec2 trans00;
  Mat3 *transformation_local;
  
  trans00.m_data = (float  [2])transformation;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&trans01,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_3c,transformation,(Vector<float,_3> *)&trans01);
  local_30 = tcu::Vector<float,_3>::xy(&local_3c);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_20);
  VVar8 = trans00;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&trans10,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_6c,(Matrix<float,_3,_3> *)VVar8.m_data,(Vector<float,_3> *)&trans10);
  local_60 = tcu::Vector<float,_3>::xy(&local_6c);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_50);
  VVar8 = trans00;
  tcu::Vector<float,_3>::Vector(&local_a8,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_9c,(Matrix<float,_3,_3> *)VVar8.m_data,&local_a8);
  local_90 = tcu::Vector<float,_3>::xy(&local_9c);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_80);
  pfVar9 = tcu::Vector<float,_2>::x(&local_80);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::x(&local_20);
  fVar2 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::x(&local_50);
  fVar3 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::x(&local_20);
  fVar4 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y(&local_80);
  fVar5 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y(&local_20);
  fVar6 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y(&local_50);
  fVar7 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y(&local_20);
  uVar10 = (ulong)(uint)(fVar3 - fVar4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)this,fVar1 - fVar2,fVar3 - fVar4,fVar5 - fVar6,fVar7 - *pfVar9);
  VVar11.m_data[2] = (float)(int)uVar10;
  VVar11.m_data[3] = (float)(int)(uVar10 >> 0x20);
  VVar11.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar11.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar11.m_data;
}

Assistant:

static Vec4 calculateLodDerivateParts(const Mat3& transformation)
{
	// Calculate transformed coordinates of three corners.
	Vec2 trans00 = (transformation * Vec3(0.0f, 0.0f, 1.0f)).xy();
	Vec2 trans01 = (transformation * Vec3(0.0f, 1.0f, 1.0f)).xy();
	Vec2 trans10 = (transformation * Vec3(1.0f, 0.0f, 1.0f)).xy();

	return Vec4(trans10.x() - trans00.x(),
				trans01.x() - trans00.x(),
				trans10.y() - trans00.y(),
				trans01.y() - trans00.y());
}